

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::DumpImplicitArgIns(FunctionBody *dumpFunction)

{
  uint32 uVar1;
  RegSlot RVar2;
  char16 *pcVar3;
  uint uVar4;
  
  if ((1 < (dumpFunction->super_ParseableFunctionInfo).m_inParamCount) &&
     (((dumpFunction->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 4) != 0)) {
    Output::Print(L"    Implicit Arg Ins:\n    ======== === ===\n    ");
    if (1 < (dumpFunction->super_ParseableFunctionInfo).m_inParamCount) {
      uVar4 = 1;
      do {
        uVar1 = FunctionBody::GetCountField(dumpFunction,ConstantCount);
        Output::Print(L" R%d ",(ulong)((uVar1 + uVar4) - 1));
        pcVar3 = OpCodeUtil::GetOpCodeName(ArgIn_A);
        Output::Print(L"%-11s",pcVar3);
        Output::Print(L"In%d\n    ",(ulong)uVar4);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (dumpFunction->super_ParseableFunctionInfo).m_inParamCount);
    }
    if ((char)(dumpFunction->super_ParseableFunctionInfo).flags < '\0') {
      RVar2 = FunctionBody::GetRestParamRegSlot(dumpFunction);
      Output::Print(L" R%d ",(ulong)RVar2);
      pcVar3 = OpCodeUtil::GetOpCodeName(ArgIn_Rest);
      Output::Print(L"%-11s",pcVar3);
      Output::Print(L"In%d\n    ",(ulong)(dumpFunction->super_ParseableFunctionInfo).m_inParamCount)
      ;
    }
    Output::Print(L"\n");
    return;
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpImplicitArgIns(FunctionBody * dumpFunction)
    {
        if (dumpFunction->GetInParamsCount() <= 1 || !dumpFunction->GetHasImplicitArgIns())
        {
            return;
        }
        Output::Print(_u("    Implicit Arg Ins:\n    ======== === ===\n    "));
        for (RegSlot reg = 1;
            reg < dumpFunction->GetInParamsCount(); reg++)
        {
            DumpReg((RegSlot)(reg + dumpFunction->GetConstantCount() - 1));
            // DisableJIT-TODO: Should this entire function be ifdefed?
#if ENABLE_NATIVE_CODEGEN
            Output::Print(_u("%-11s"), OpCodeUtil::GetOpCodeName(Js::OpCode::ArgIn_A));
#endif
            Output::Print(_u("In%d\n    "), reg);
        }
        if (dumpFunction->GetHasRestParameter())
        {
            DumpReg(dumpFunction->GetRestParamRegSlot());
#if ENABLE_NATIVE_CODEGEN
            Output::Print(_u("%-11s"), OpCodeUtil::GetOpCodeName(Js::OpCode::ArgIn_Rest));
#endif
            Output::Print(_u("In%d\n    "), dumpFunction->GetInParamsCount());
        }
        Output::Print(_u("\n"));
    }